

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O0

bool draco::parser::ParseString(DecoderBuffer *buffer,string *out_string)

{
  bool bVar1;
  DecoderBuffer *in_RSI;
  char c;
  bool end_reached;
  undefined5 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe5;
  char in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  byte bVar2;
  
  std::__cxx11::string::clear();
  SkipWhitespace((DecoderBuffer *)
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,
                                   CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))));
  bVar2 = 0;
  while( true ) {
    bVar1 = PeekWhitespace(in_RSI,(bool *)CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffe6,
                                                                  CONCAT15(in_stack_ffffffffffffffe5
                                                                           ,
                                                  in_stack_ffffffffffffffe0))));
    in_stack_ffffffffffffffe5 = 0;
    if (!bVar1) {
      in_stack_ffffffffffffffe5 = bVar2 ^ 0xff;
    }
    if ((in_stack_ffffffffffffffe5 & 1) == 0) break;
    bVar1 = DecoderBuffer::Decode<char>
                      (in_RSI,(char *)CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffe6,
                                                              CONCAT15(in_stack_ffffffffffffffe5,
                                                                       in_stack_ffffffffffffffe0))))
    ;
    if (!bVar1) {
      return false;
    }
    std::__cxx11::string::operator+=((string *)in_RSI,in_stack_ffffffffffffffe6);
  }
  return true;
}

Assistant:

bool ParseString(DecoderBuffer *buffer, std::string *out_string) {
  out_string->clear();
  SkipWhitespace(buffer);
  bool end_reached = false;
  while (!PeekWhitespace(buffer, &end_reached) && !end_reached) {
    char c;
    if (!buffer->Decode(&c)) {
      return false;
    }
    *out_string += c;
  }
  return true;
}